

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UChar * __thiscall
icu_63::TZGNCore::getPartialLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *mzID,UBool isLong,
          UnicodeString *mzDisplayName)

{
  UBool UVar1;
  int32_t length;
  undefined8 *key_00;
  int *value;
  GNameInfo *nameinfo;
  PartialLocationKey *cacheKey;
  undefined1 local_178 [8];
  UnicodeString name;
  undefined1 local_130 [4];
  UErrorCode status;
  UnicodeString regionalGolden;
  char local_e8 [4];
  int32_t ccLen;
  char countryCode [4];
  undefined1 local_d8 [8];
  UnicodeString usCountryCode;
  UnicodeString location;
  UChar *uplname;
  PartialLocationKey key;
  UnicodeString *mzDisplayName_local;
  UBool isLong_local;
  UnicodeString *mzID_local;
  UnicodeString *tzCanonicalID_local;
  TZGNCore *this_local;
  
  key._16_8_ = mzDisplayName;
  uplname = ZoneMeta::findTimeZoneID(tzCanonicalID);
  key.tzID = ZoneMeta::findMetaZoneID(mzID);
  key.mzID._0_1_ = isLong;
  this_local = (TZGNCore *)uhash_get_63(this->fPartialLocationNamesMap,&uplname);
  if (this_local == (TZGNCore *)0x0) {
    UnicodeString::UnicodeString((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)local_d8);
    ZoneMeta::getCanonicalCountry(tzCanonicalID,(UnicodeString *)local_d8,(UBool *)0x0);
    UVar1 = UnicodeString::isEmpty((UnicodeString *)local_d8);
    if (UVar1 == '\0') {
      length = UnicodeString::length((UnicodeString *)local_d8);
      regionalGolden.fUnion._52_4_ =
           UnicodeString::extract((UnicodeString *)local_d8,0,length,local_e8,4,kInvariant);
      local_e8[(int)regionalGolden.fUnion._52_4_] = '\0';
      UnicodeString::UnicodeString((UnicodeString *)local_130);
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                (this->fTimeZoneNames,mzID,local_e8,local_130);
      UVar1 = UnicodeString::operator==(tzCanonicalID,(UnicodeString *)local_130);
      if (UVar1 == '\0') {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                  (this->fTimeZoneNames,tzCanonicalID,
                   (undefined1 *)((long)&usCountryCode.fUnion + 0x30));
      }
      else {
        (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[0xb])
                  (this->fLocaleDisplayNames,local_e8,
                   (undefined1 *)((long)&usCountryCode.fUnion + 0x30));
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_130);
    }
    else {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                (this->fTimeZoneNames,tzCanonicalID,
                 (undefined1 *)((long)&usCountryCode.fUnion + 0x30));
      UVar1 = UnicodeString::isEmpty((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
      if (UVar1 != '\0') {
        UnicodeString::setTo((UnicodeString *)((long)&usCountryCode.fUnion + 0x30),tzCanonicalID);
      }
    }
    name.fUnion._52_4_ = 0;
    UnicodeString::UnicodeString((UnicodeString *)local_178);
    SimpleFormatter::format
              (&this->fFallbackFormat,(UnicodeString *)((long)&usCountryCode.fUnion + 0x30),
               (UnicodeString *)key._16_8_,(UnicodeString *)local_178,
               (UErrorCode *)(name.fUnion.fStackFields.fBuffer + 0x19));
    UVar1 = ::U_FAILURE(name.fUnion._52_4_);
    if (UVar1 == '\0') {
      this_local = (TZGNCore *)
                   ZNStringPool::get(&this->fStringPool,(UnicodeString *)local_178,
                                     (UErrorCode *)(name.fUnion.fStackFields.fBuffer + 0x19));
      UVar1 = ::U_SUCCESS(name.fUnion._52_4_);
      if ((UVar1 != '\0') &&
         (key_00 = (undefined8 *)uprv_malloc_63(0x18), key_00 != (undefined8 *)0x0)) {
        *key_00 = uplname;
        key_00[1] = key.tzID;
        *(UBool *)(key_00 + 2) = (UBool)key.mzID;
        uhash_put_63(this->fPartialLocationNamesMap,key_00,this_local,
                     (UErrorCode *)(name.fUnion.fStackFields.fBuffer + 0x19));
        UVar1 = ::U_FAILURE(name.fUnion._52_4_);
        if (UVar1 == '\0') {
          value = (int *)uprv_malloc_63(0x10);
          if (value != (int *)0x0) {
            *value = (isLong == '\0') + 2 + (uint)(isLong == '\0');
            *(UChar **)(value + 2) = uplname;
            TextTrieMap::put(&this->fGNamesTrie,(UChar *)this_local,value,
                             (UErrorCode *)(name.fUnion.fStackFields.fBuffer + 0x19));
          }
        }
        else {
          uprv_free_63(key_00);
        }
      }
    }
    else {
      this_local = (TZGNCore *)0x0;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_178);
    UnicodeString::~UnicodeString((UnicodeString *)local_d8);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
  }
  return (UChar *)this_local;
}

Assistant:

const UChar*
TZGNCore::getPartialLocationName(const UnicodeString& tzCanonicalID,
                        const UnicodeString& mzID, UBool isLong, const UnicodeString& mzDisplayName) {
    U_ASSERT(!tzCanonicalID.isEmpty());
    U_ASSERT(!mzID.isEmpty());
    U_ASSERT(!mzDisplayName.isEmpty());

    PartialLocationKey key;
    key.tzID = ZoneMeta::findTimeZoneID(tzCanonicalID);
    key.mzID = ZoneMeta::findMetaZoneID(mzID);
    key.isLong = isLong;
    U_ASSERT(key.tzID != NULL && key.mzID != NULL);

    const UChar* uplname = (const UChar*)uhash_get(fPartialLocationNamesMap, (void *)&key);
    if (uplname != NULL) {
        return uplname;
    }

    UnicodeString location;
    UnicodeString usCountryCode;
    ZoneMeta::getCanonicalCountry(tzCanonicalID, usCountryCode);
    if (!usCountryCode.isEmpty()) {
        char countryCode[ULOC_COUNTRY_CAPACITY];
        U_ASSERT(usCountryCode.length() < ULOC_COUNTRY_CAPACITY);
        int32_t ccLen = usCountryCode.extract(0, usCountryCode.length(), countryCode, sizeof(countryCode), US_INV);
        countryCode[ccLen] = 0;

        UnicodeString regionalGolden;
        fTimeZoneNames->getReferenceZoneID(mzID, countryCode, regionalGolden);
        if (tzCanonicalID == regionalGolden) {
            // Use country name
            fLocaleDisplayNames->regionDisplayName(countryCode, location);
        } else {
            // Otherwise, use exemplar city name
            fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        }
    } else {
        fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        if (location.isEmpty()) {
            // This could happen when the time zone is not associated with a country,
            // and its ID is not hierarchical, for example, CST6CDT.
            // We use the canonical ID itself as the location for this case.
            location.setTo(tzCanonicalID);
        }
    }

    UErrorCode status = U_ZERO_ERROR;
    UnicodeString name;
    fFallbackFormat.format(location, mzDisplayName, name, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    uplname = fStringPool.get(name, status);
    if (U_SUCCESS(status)) {
        // Add the name to cache
        PartialLocationKey* cacheKey = (PartialLocationKey *)uprv_malloc(sizeof(PartialLocationKey));
        if (cacheKey != NULL) {
            cacheKey->tzID = key.tzID;
            cacheKey->mzID = key.mzID;
            cacheKey->isLong = key.isLong;
            uhash_put(fPartialLocationNamesMap, (void *)cacheKey, (void *)uplname, &status);
            if (U_FAILURE(status)) {
                uprv_free(cacheKey);
            } else {
                // put the name to the local trie as well
                GNameInfo *nameinfo = (ZNameInfo *)uprv_malloc(sizeof(GNameInfo));
                if (nameinfo != NULL) {
                    nameinfo->type = isLong ? UTZGNM_LONG : UTZGNM_SHORT;
                    nameinfo->tzID = key.tzID;
                    fGNamesTrie.put(uplname, nameinfo, status);
                }
            }
        }
    }
    return uplname;
}